

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lattices.cpp
# Opt level: O0

void __thiscall ValTypeLattice_Join_Test::~ValTypeLattice_Join_Test(ValTypeLattice_Join_Test *this)

{
  ValTypeLattice_Join_Test *this_local;
  
  ~ValTypeLattice_Join_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ValTypeLattice, Join) {
  analysis::ValType valtype;
  testDiamondJoin(valtype, Type::unreachable, Type::i32, Type::f32, Type::none);
  testDiamondJoin(valtype,
                  Type(HeapType::none, NonNullable),
                  Type(HeapType::struct_, NonNullable),
                  Type(HeapType::array, Nullable),
                  Type(HeapType::eq, Nullable));
}